

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseFuncModuleField(WastParser *this,Module *module)

{
  pointer pbVar1;
  _Head_base<0UL,_wabt::FuncImport_*,_false> _Var2;
  bool bVar3;
  Result RVar4;
  long lVar5;
  Enum EVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined1 local_128 [8];
  Location loc;
  TypeVector local_types;
  string local_e8 [32];
  string local_c8 [32];
  undefined1 auStack_a8 [8];
  ModuleFieldList export_fields;
  undefined1 local_88 [8];
  string name;
  _Head_base<0UL,_wabt::FuncModuleField_*,_false> local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  _Head_base<0UL,_wabt::FuncImport_*,_false> local_40;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator_type local_31;
  
  RVar4 = Expect(this,Lpar);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  GetLocation((Location *)local_128,this);
  RVar4 = Expect(this,Func);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  local_88 = (undefined1  [8])&name._M_string_length;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length._0_1_ = 0;
  ParseBindVarOpt(this,(string *)local_88);
  auStack_a8 = (undefined1  [8])0x0;
  export_fields.first_ = (ModuleField *)0x0;
  export_fields.last_ = (ModuleField *)0x0;
  RVar4 = ParseInlineExports(this,(ModuleFieldList *)auStack_a8,First);
  EVar6 = Error;
  if (RVar4.enum_ == Error) goto LAB_00da728f;
  bVar3 = PeekMatchLpar(this,Import);
  if (bVar3) {
    CheckImportOrdering(this,module);
    MakeUnique<wabt::FuncImport,std::__cxx11::string&>
              ((wabt *)&local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    _Var2._M_head_impl = local_40._M_head_impl;
    RVar4 = ParseInlineImport(this,(Import *)local_40._M_head_impl);
    if (((RVar4.enum_ != Error) &&
        (RVar4 = ParseTypeUseOpt(this,(FuncDeclaration *)
                                      (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)&(_Var2._M_head_impl)->func)->_M_local_buf + 0x20)),
        RVar4.enum_ != Error)) &&
       (RVar4 = ParseFuncSignature(this,(FuncSignature *)
                                        (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)&(_Var2._M_head_impl)->func)->_M_local_buf + 0x70),
                                   (BindingHash *)
                                   (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                      *)&(_Var2._M_head_impl)->func)->_M_local_buf + 0xb8)),
       RVar4.enum_ != Error)) {
      std::__cxx11::string::string((string *)(loc.field_1.field2 + 8),"type",&local_34);
      std::__cxx11::string::string(local_e8,"param",&local_33);
      std::__cxx11::string::string(local_c8,"result",&local_32);
      __l._M_len = 3;
      __l._M_array = (iterator)((long)&loc.field_1 + 8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_58,__l,&local_31);
      RVar4 = ErrorIfLpar(this,&local_58,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_58);
      lVar5 = 0x40;
      do {
        std::__cxx11::string::~string((string *)((long)&loc.field_1 + lVar5 + 8));
        lVar5 = lVar5 + -0x20;
      } while (lVar5 != -0x20);
      if (RVar4.enum_ != Error) {
        GetLocation((Location *)((long)&loc.field_1 + 8),this);
        MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::FuncImport,std::default_delete<wabt::FuncImport>>,wabt::Location>
                  ((wabt *)&local_58,
                   (unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> *)&local_40
                   ,(Location *)((long)&loc.field_1 + 8));
        name.field_2._8_8_ =
             local_58.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                    *)((long)&name.field_2 + 8));
        if (name.field_2._8_8_ != 0) {
          (**(code **)(*(long *)name.field_2._8_8_ + 8))();
        }
        name.field_2._8_8_ = 0;
        if ((FuncImport *)
            local_58.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (FuncImport *)0x0) {
          (*(((ImportMixin<(wabt::ExternalKind)0> *)
             &(local_58.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)->super_Import)._vptr_Import
            [1])();
        }
LAB_00da7359:
        if (local_40._M_head_impl != (FuncImport *)0x0) {
          (*((local_40._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)0>).super_Import.
            _vptr_Import[1])();
        }
        anon_unknown_1::AppendInlineExportFields
                  (module,(ModuleFieldList *)auStack_a8,
                   (int)((ulong)((long)(module->funcs).
                                       super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(module->funcs).
                                      super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
        RVar4 = Expect(this,Rpar);
        EVar6 = (Enum)(RVar4.enum_ == Error);
        goto LAB_00da728f;
      }
    }
  }
  else {
    MakeUnique<wabt::FuncModuleField,wabt::Location&,std::__cxx11::string&>
              ((wabt *)&local_58,(Location *)local_128,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    pbVar1 = local_58.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    RVar4 = ParseTypeUseOpt(this,(FuncDeclaration *)
                                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)((long)local_58.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 0x50) + 1));
    local_40._M_head_impl =
         (FuncImport *)
         local_58.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    if (RVar4.enum_ != Error) {
      RVar4 = ParseFuncSignature(this,(FuncSignature *)
                                      (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)((long)pbVar1 + 0x50))->_M_local_buf + 0x60),
                                 (BindingHash *)
                                 (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                    *)((long)pbVar1 + 0x50))->_M_local_buf + 0xa8));
      local_40._M_head_impl =
           (FuncImport *)
           local_58.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      if (RVar4.enum_ != Error) {
        loc.field_1._8_8_ = 0;
        RVar4 = ParseBoundValueTypeList
                          (this,Local,(TypeVector *)((long)&loc.field_1 + 8),
                           (BindingHash *)
                           (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)((long)pbVar1 + 0x50))->_M_local_buf + 0xa8),
                           (Index)((ulong)(*(long *)(((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)((long)pbVar1 + 0x50))->_M_local_buf + 0x68) -
                                          *(long *)(((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)((long)pbVar1 + 0x50))->_M_local_buf + 0x60)) >>
                                  2));
        if (RVar4.enum_ != Error) {
          LocalTypes::Set((LocalTypes *)
                          (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)((long)pbVar1 + 0x50))->_M_local_buf + 0x90),
                          (TypeVector *)((long)&loc.field_1 + 8));
          RVar4 = ParseTerminatingInstrList
                            (this,(ExprList *)
                                  (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)((long)pbVar1 + 0x50))->_M_local_buf + 0xe0));
          if (RVar4.enum_ != Error) {
            local_60._M_head_impl =
                 (FuncModuleField *)
                 local_58.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_58.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            Module::AppendField(module,(unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>
                                        *)&local_60);
            if (local_60._M_head_impl != (FuncModuleField *)0x0) {
              (*((local_60._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).
                super_ModuleField._vptr_ModuleField[1])();
            }
            local_60._M_head_impl = (FuncModuleField *)0x0;
            std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
                      ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)
                       ((long)&loc.field_1 + 8));
            local_40._M_head_impl =
                 (FuncImport *)
                 local_58.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            goto LAB_00da7359;
          }
        }
        std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
                  ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)((long)&loc.field_1 + 8)
                  );
        local_40._M_head_impl =
             (FuncImport *)
             local_58.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
    }
  }
  if (local_40._M_head_impl != (FuncImport *)0x0) {
    (*((local_40._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)0>).super_Import._vptr_Import
      [1])();
  }
LAB_00da728f:
  intrusive_list<wabt::ModuleField>::clear((intrusive_list<wabt::ModuleField> *)auStack_a8);
  std::__cxx11::string::~string((string *)local_88);
  return (Result)EVar6;
}

Assistant:

Result WastParser::ParseFuncModuleField(Module* module) {
  WABT_TRACE(ParseFuncModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Func);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Func));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = MakeUnique<FuncImport>(name);
    Func& func = import->func;
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseTypeUseOpt(&func.decl));
    CHECK_RESULT(ParseFuncSignature(&func.decl.sig, &func.bindings));
    CHECK_RESULT(ErrorIfLpar({"type", "param", "result"}));
    auto field =
        MakeUnique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = MakeUnique<FuncModuleField>(loc, name);
    Func& func = field->func;
    CHECK_RESULT(ParseTypeUseOpt(&func.decl));
    CHECK_RESULT(ParseFuncSignature(&func.decl.sig, &func.bindings));
    TypeVector local_types;
    CHECK_RESULT(ParseBoundValueTypeList(TokenType::Local, &local_types,
                                         &func.bindings, func.GetNumParams()));
    func.local_types.Set(local_types);
    CHECK_RESULT(ParseTerminatingInstrList(&func.exprs));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->funcs.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}